

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O2

void __thiscall luna::GC::DestroyGeneration(GC *this,GenInfo *gen)

{
  GCObject *__args;
  
  while (__args = gen->gen_, __args != (GCObject *)0x0) {
    gen->gen_ = __args->next_;
    std::function<void_(luna::GCObject_*,_unsigned_int)>::operator()
              (&this->obj_deleter_,__args,(uint)((byte)__args->field_0x10 >> 4));
  }
  gen->count_ = 0;
  return;
}

Assistant:

void GC::DestroyGeneration(GenInfo &gen)
    {
        while (gen.gen_)
        {
            GCObject *obj = gen.gen_;
            gen.gen_ = gen.gen_->next_;
            obj_deleter_(obj, obj->gc_obj_type_);
        }
        gen.count_ = 0;
    }